

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall soul::ASTVisitor::visitObject(ASTVisitor *this,Statement *t)

{
  allocator<char> local_39;
  string local_38;
  Statement *local_18;
  Statement *t_local;
  ASTVisitor *this_local;
  
  local_18 = t;
  t_local = (Statement *)this;
  switch((t->super_ASTObject).objectType) {
  case Block:
    (*this->_vptr_ASTVisitor[9])(this,t);
    break;
  case BreakStatement:
    (*this->_vptr_ASTVisitor[0x1c])(this,t);
    break;
  case ContinueStatement:
    (*this->_vptr_ASTVisitor[0x1d])(this,t);
    break;
  case IfStatement:
    (*this->_vptr_ASTVisitor[0x1b])(this,t);
    break;
  case LoopStatement:
    (*this->_vptr_ASTVisitor[0x1e])(this,t);
    break;
  case NoopStatement:
    (*this->_vptr_ASTVisitor[0x1f])(this,t);
    break;
  case ReturnStatement:
    (*this->_vptr_ASTVisitor[0x19])(this,t);
    break;
  case VariableDeclaration:
    (*this->_vptr_ASTVisitor[0xe])(this,t);
    break;
  case ConcreteType:
    (*this->_vptr_ASTVisitor[0x24])(this,t);
    break;
  case SubscriptWithBrackets:
    (*this->_vptr_ASTVisitor[0x29])(this,t);
    break;
  case SubscriptWithChevrons:
    (*this->_vptr_ASTVisitor[0x2a])(this,t);
    break;
  case TypeMetaFunction:
    (*this->_vptr_ASTVisitor[0x2b])(this,t);
    break;
  case Assignment:
    (*this->_vptr_ASTVisitor[0x10])(this,t);
    break;
  case BinaryOperator:
    (*this->_vptr_ASTVisitor[0xc])(this,t);
    break;
  case Constant:
    (*this->_vptr_ASTVisitor[10])(this,t);
    break;
  case DotOperator:
    (*this->_vptr_ASTVisitor[0x39])(this,t);
    break;
  case CallOrCast:
    (*this->_vptr_ASTVisitor[0x11])(this,t);
    break;
  case FunctionCall:
    (*this->_vptr_ASTVisitor[0x12])(this,t);
    break;
  case TypeCast:
    (*this->_vptr_ASTVisitor[0x13])(this,t);
    break;
  case PreOrPostIncOrDec:
    (*this->_vptr_ASTVisitor[0x17])(this,t);
    break;
  case InPlaceOperator:
    (*this->_vptr_ASTVisitor[0x18])(this,t);
    break;
  case ArrayElementRef:
    (*this->_vptr_ASTVisitor[0x14])(this,t);
    break;
  case StructMemberRef:
    (*this->_vptr_ASTVisitor[0x15])(this,t);
    break;
  case ComplexMemberRef:
    (*this->_vptr_ASTVisitor[0x16])(this,t);
    break;
  case StructDeclaration:
    (*this->_vptr_ASTVisitor[0x25])(this,t);
    break;
  case StructDeclarationRef:
    (*this->_vptr_ASTVisitor[0x26])(this,t);
    break;
  case UsingDeclaration:
    (*this->_vptr_ASTVisitor[0x27])(this,t);
    break;
  case TernaryOp:
    (*this->_vptr_ASTVisitor[0x1a])(this,t);
    break;
  case UnaryOperator:
    (*this->_vptr_ASTVisitor[0xd])(this,t);
    break;
  case QualifiedIdentifier:
    (*this->_vptr_ASTVisitor[0x37])(this,t);
    break;
  case UnqualifiedName:
    (*this->_vptr_ASTVisitor[0x38])(this,t);
    break;
  case VariableRef:
    (*this->_vptr_ASTVisitor[0xf])(this,t);
    break;
  case InputEndpointRef:
    (*this->_vptr_ASTVisitor[0x2e])(this,t);
    break;
  case OutputEndpointRef:
    (*this->_vptr_ASTVisitor[0x2f])(this,t);
    break;
  case ConnectionEndpointRef:
    (*this->_vptr_ASTVisitor[0x30])(this,t);
    break;
  case ProcessorRef:
    (*this->_vptr_ASTVisitor[0x33])(this,t);
    break;
  case NamespaceRef:
    (*this->_vptr_ASTVisitor[0x34])(this,t);
    break;
  case ProcessorInstanceRef:
    (*this->_vptr_ASTVisitor[0x35])(this,t);
    break;
  case CommaSeparatedList:
    (*this->_vptr_ASTVisitor[0x36])(this,t);
    break;
  case ProcessorProperty:
    (*this->_vptr_ASTVisitor[0x21])(this,t);
    break;
  case WriteToEndpoint:
    (*this->_vptr_ASTVisitor[0x20])(this,t);
    break;
  case AdvanceClock:
    (*this->_vptr_ASTVisitor[0x22])(this,t);
    break;
  case StaticAssertion:
    (*this->_vptr_ASTVisitor[0x3a])(this,t);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unknown AST statement",&local_39);
    throwInternalCompilerError(&local_38);
  }
  return;
}

Assistant:

virtual void visitObject (AST::Statement& t)
    {
        switch (t.objectType)
        {
            SOUL_AST_STATEMENTS (SOUL_INVOKE_FOR_SUBCLASS)
            default: throwInternalCompilerError ("Unknown AST statement"); break;
        }
    }